

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

int __thiscall deqp::egl::Image::ImageFormatCase::init(ImageFormatCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *pppIVar1;
  NativeDisplay *pNVar2;
  iterator __position;
  Visibility VVar3;
  int iVar4;
  int extraout_EAX;
  Library *egl;
  NativeWindowFactory *pNVar5;
  EGLDisplay pvVar6;
  Library *egl_00;
  EGLConfig pvVar7;
  undefined4 extraout_var;
  EGLSurface pvVar8;
  pointer pAVar9;
  GLES2ImageApi *this_00;
  long lVar10;
  EGLint attribList [15];
  GLES2ImageApi *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pNVar5 = eglu::selectNativeWindowFactory
                     (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  pvVar6 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar6;
  uStack_48 = 0x3025;
  uStack_44 = 0x303800000008;
  uStack_58 = 0x800003023;
  uStack_50 = 0x3021;
  local_4c = 8;
  local_68 = 0x800003024;
  uStack_60 = 0x800003022;
  local_78 = (GLES2ImageApi *)0x400003040;
  uStack_70 = 0x400003033;
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar7 = eglu::chooseSingleConfig(egl_00,this->m_display,(EGLint *)&local_78);
  this->m_config = pvVar7;
  pvVar6 = this->m_display;
  pNVar2 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
           super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
           ptr;
  VVar3 = eglu::parseWindowVisibility
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  local_78 = (GLES2ImageApi *)0x1e0000001e0;
  uStack_70 = CONCAT44(uStack_70._4_4_,VVar3);
  iVar4 = (*(pNVar5->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar5,pNVar2,pvVar6,pvVar7);
  this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar4);
  pvVar8 = eglu::createWindowSurface
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar4),this->m_display,
                      this->m_config,(EGLAttrib *)0x0);
  this->m_surface = pvVar8;
  local_78 = (GLES2ImageApi *)0x1bd8aa0;
  EglTestContext::initGLFunctions
            ((this->super_TestCase).m_eglTestCtx,&this->m_gl,(ApiType)0x2,1,(char **)&local_78);
  pAVar9 = (this->m_spec).contexts.
           super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_spec).contexts.
                              super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar9) >> 2)) {
    lVar10 = 0;
    do {
      local_78 = (GLES2ImageApi *)0x0;
      if (pAVar9[lVar10] == API_GLES2) {
        this_00 = (GLES2ImageApi *)operator_new(0x50);
        GLES2ImageApi::GLES2ImageApi
                  (this_00,egl,&this->m_gl,(int)lVar10,(this->super_CallLogWrapper).m_log,
                   this->m_display,this->m_surface,this->m_config);
        local_78 = this_00;
      }
      __position._M_current =
           (this->m_apiContexts).
           super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_apiContexts).
          super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<deqp::egl::Image::ImageApi*,std::allocator<deqp::egl::Image::ImageApi*>>::
        _M_realloc_insert<deqp::egl::Image::ImageApi*const&>
                  ((vector<deqp::egl::Image::ImageApi*,std::allocator<deqp::egl::Image::ImageApi*>>
                    *)&this->m_apiContexts,__position,(ImageApi **)&local_78);
      }
      else {
        *__position._M_current = &local_78->super_ImageApi;
        pppIVar1 = &(this->m_apiContexts).
                    super__Vector_base<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
      }
      lVar10 = lVar10 + 1;
      pAVar9 = (this->m_spec).contexts.
               super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar10 < (int)((ulong)((long)(this->m_spec).contexts.
                                          super__Vector_base<deqp::egl::Image::TestSpec::ApiContext,_std::allocator<deqp::egl::Image::TestSpec::ApiContext>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar9)
                           >> 2));
  }
  checkExtensions(this);
  return extraout_EAX;
}

Assistant:

void ImageFormatCase::init (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	try
	{
		m_display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
		m_config	= getConfig();
		m_window	= windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_display, m_config, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
		m_surface	= eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_display, m_config, DE_NULL);

		{
			const char* extensions[] = { "GL_OES_EGL_image" };
			m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2, 0), DE_LENGTH_OF_ARRAY(extensions), &extensions[0]);
		}

		for (int contextNdx = 0; contextNdx < (int)m_spec.contexts.size(); contextNdx++)
		{
			ImageApi* api = DE_NULL;
			switch (m_spec.contexts[contextNdx])
			{
				case TestSpec::API_GLES2:
				{
					api = new GLES2ImageApi(egl, m_gl, contextNdx, getLog(), m_display, m_surface, m_config);
					break;
				}

				default:
					DE_ASSERT(false);
					break;
			}
			m_apiContexts.push_back(api);
		}
		checkExtensions();
	}
	catch (...)
	{
		deinit();
		throw;
	}
}